

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O1

ssize_t __thiscall
zmq::ypipe_t<zmq::command_t,_16>::read
          (ypipe_t<zmq::command_t,_16> *this,int __fd,void *__buf,size_t __nbytes)

{
  atomic_ptr_t<zmq::yqueue_t<zmq::command_t,_16>::chunk_t> *paVar1;
  args_t *paVar2;
  endpoint_uri_pair_t **ppeVar3;
  undefined1 *puVar4;
  __pointer_type __ptr;
  chunk_t *pcVar5;
  chunk_t *pcVar6;
  undefined8 *puVar7;
  object_t *poVar8;
  undefined8 uVar9;
  own_t *poVar10;
  own_t *poVar11;
  endpoint_uri_pair_t *peVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  
  puVar7 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  bVar15 = check_read(this);
  if (bVar15) {
    pcVar5 = (this->_queue)._begin_chunk;
    iVar16 = (this->_queue)._begin_pos;
    poVar8 = pcVar5->values[iVar16].destination;
    uVar9 = *(undefined8 *)&pcVar5->values[iVar16].type;
    paVar2 = &pcVar5->values[iVar16].args;
    poVar10 = (paVar2->own).object;
    poVar11 = (&paVar2->own)[1].object;
    ppeVar3 = &pcVar5->values[iVar16].args.pipe_peer_stats.endpoint_pair;
    peVar12 = *ppeVar3;
    uVar13 = ppeVar3[1];
    puVar4 = &pcVar5->values[iVar16].field_0x30;
    uVar14 = *(undefined8 *)(puVar4 + 8);
    puVar7[6] = *(undefined8 *)puVar4;
    puVar7[7] = uVar14;
    puVar7[4] = peVar12;
    puVar7[5] = uVar13;
    puVar7[2] = poVar10;
    puVar7[3] = poVar11;
    *puVar7 = poVar8;
    puVar7[1] = uVar9;
    iVar16 = (this->_queue)._begin_pos + 1;
    (this->_queue)._begin_pos = iVar16;
    if (iVar16 == 0x10) {
      pcVar5 = (this->_queue)._begin_chunk;
      pcVar6 = pcVar5->next;
      (this->_queue)._begin_chunk = pcVar6;
      pcVar6->prev = (chunk_t *)0x0;
      (this->_queue)._begin_pos = 0;
      LOCK();
      paVar1 = &(this->_queue)._spare_chunk;
      __ptr = (paVar1->_ptr)._M_b._M_p;
      (paVar1->_ptr)._M_b._M_p = pcVar5;
      UNLOCK();
      free(__ptr);
    }
  }
  return CONCAT71(extraout_var,bVar15) & 0xffffffff;
}

Assistant:

bool read (T *value_)
    {
        //  Try to prefetch a value.
        if (!check_read ())
            return false;

        //  There was at least one value prefetched.
        //  Return it to the caller.
        *value_ = _queue.front ();
        _queue.pop ();
        return true;
    }